

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_aa32_st_i64(DisasContext_conflict1 *s,TCGv_i64 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar1;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 ret;
  
  s_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)s_00);
  tcg_gen_extu_i32_i64_aarch64(s_00,ret,a32);
  if ((s->uc->mode & UC_MODE_ARMBE8) != UC_MODE_ARM) {
    if ((s->sctlr_b != 0) && ((opc & MO_64) < MO_32)) {
      tcg_gen_xori_i64_aarch64(s_00,ret,ret,(ulong)((-1 << (sbyte)(opc & MO_64)) + 4));
      if ((s->uc->mode & UC_MODE_ARMBE8) == UC_MODE_ARM) goto LAB_00653e45;
    }
    if (s->sctlr_b != 0) {
      pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_rotri_i64_aarch64(s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),val,0x20);
      tcg_gen_qemu_st_i64_aarch64
                (s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),ret,(ulong)(uint)index,opc);
      tcg_temp_free_internal_aarch64(s_00,pTVar1);
      goto LAB_00653e5a;
    }
  }
LAB_00653e45:
  tcg_gen_qemu_st_i64_aarch64(s_00,val,ret,(ulong)(uint)index,opc);
LAB_00653e5a:
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  return;
}

Assistant:

static void gen_aa32_st_i64(DisasContext *s, TCGv_i64 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr = gen_aa32_addr(s, a32, opc);

    /* Not needed for user-mode BE32, where we use MO_BE instead.  */
    // Unicorn: By default UC_MODE_BIG_MODE is BE32 mode, which in fact qemu-usermode.
    //          Thus, we only do this in BE8 (qemu system) mode.
    if ( (s->uc->mode & UC_MODE_ARMBE8) && s->sctlr_b) {
        TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_rotri_i64(tcg_ctx, tmp, val, 32);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, addr, index, opc);
        tcg_temp_free_i64(tcg_ctx, tmp);
    } else {
        tcg_gen_qemu_st_i64(tcg_ctx, val, addr, index, opc);
    }
    tcg_temp_free(tcg_ctx, addr);
}